

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paladin.c
# Opt level: O0

void spell_shield_of_faith(int level,int sn,CHAR_DATA *ch,void *vo,int target)

{
  bool bVar1;
  CHAR_DATA *in_RCX;
  CHAR_DATA *in_RDX;
  CHAR_DATA *to;
  AFFECT_DATA af;
  AFFECT_DATA *in_stack_ffffffffffffff68;
  CHAR_DATA *in_stack_ffffffffffffff78;
  char *in_stack_ffffffffffffff80;
  
  if (in_RCX == (CHAR_DATA *)0x0) {
    in_RCX = in_RDX;
  }
  bVar1 = is_affected(in_RDX,(int)gsn_shield_of_faith);
  if ((bVar1) && (in_RDX == in_RCX)) {
    send_to_char(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  }
  else {
    bVar1 = is_affected(in_RCX,(int)gsn_shield_of_faith);
    if (bVar1) {
      send_to_char(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    }
    else {
      act(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_RCX,in_stack_ffffffffffffff68,0);
      act(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_RCX,in_stack_ffffffffffffff68,0);
      init_affect((AFFECT_DATA *)0x766c77);
      affect_to_char(in_RCX,in_stack_ffffffffffffff68);
    }
  }
  return;
}

Assistant:

void spell_shield_of_faith(int level, int sn, CHAR_DATA *ch, void *vo, int target)
{
	AFFECT_DATA af;
	CHAR_DATA *to = (CHAR_DATA *)vo;

	if (to == nullptr)
		to = ch;

	if (is_affected(ch, gsn_shield_of_faith) && ch == to)
	{
		send_to_char("You are already surrounded by a shield of faith.\n\r", ch);
		return;
	}

	if (is_affected(to, gsn_shield_of_faith))
	{
		send_to_char("They are already surrounded by a shield of faith.\n\r", ch);
		return;
	}

	act("A pearly white barrier flickers into existence around you.", to, 0, 0, TO_CHAR);
	act("A pearly white barrier flickers into existence around $n.", to, 0, 0, TO_ROOM);

	init_affect(&af);
	af.level = ch->level;
	af.type = gsn_shield_of_faith;
	af.where = TO_AFFECTS;
	af.aftype = AFT_COMMUNE;
	af.location = APPLY_NONE;
	af.modifier = 0;
	af.duration = ch->level / 3;
	af.mod_name = MOD_PROTECTION;
	affect_to_char(to, &af);
}